

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ParserResult * __thiscall Catch::clara::detail::ExeName::set(ExeName *this,string *newName)

{
  bool bVar1;
  long lVar2;
  element_type *this_00;
  element_type *peVar3;
  string *in_RDX;
  long in_RSI;
  ParserResult *in_RDI;
  long in_FS_OFFSET;
  size_type lastSlash;
  string filename;
  ParseResultType *in_stack_ffffffffffffff78;
  __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff80;
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = ::std::__cxx11::string::find_last_of((char *)in_RDX,0x2fb849);
  if (lVar2 == -1) {
    ::std::__cxx11::string::string(local_28,in_RDX);
  }
  else {
    ::std::__cxx11::string::substr((ulong)local_28,(ulong)in_RDX);
  }
  this_00 = std::
            __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*(in_stack_ffffffffffffff80);
  ::std::__cxx11::string::operator=((string *)this_00,local_28);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x18));
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x287272);
    (*(peVar3->super_BoundRef)._vptr_BoundRef[4])(in_RDI,peVar3,local_28);
  }
  else {
    BasicResult<Catch::clara::detail::ParseResultType>::ok<Catch::clara::detail::ParseResultType>
              (in_stack_ffffffffffffff78);
  }
  ::std::__cxx11::string::~string(local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

auto set( std::string const& newName ) -> ParserResult {

            auto lastSlash = newName.find_last_of( "\\/" );
            auto filename = ( lastSlash == std::string::npos )
                    ? newName
                    : newName.substr( lastSlash+1 );

            *m_name = filename;
            if( m_ref )
                return m_ref->setValue( filename );
            else
                return ParserResult::ok( ParseResultType::Matched );
        }